

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::ArenaTest_CreateAndNonConstCopy_Test::~ArenaTest_CreateAndNonConstCopy_Test
          (ArenaTest_CreateAndNonConstCopy_Test *this)

{
  ArenaTest_CreateAndNonConstCopy_Test *this_local;
  
  ~ArenaTest_CreateAndNonConstCopy_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaTest, CreateAndNonConstCopy) {
  Arena arena;
  std::string s("foo");
  const std::string* s_copy = Arena::Create<std::string>(&arena, s);
  EXPECT_TRUE(s_copy != nullptr);
  EXPECT_EQ("foo", s);
  EXPECT_EQ("foo", *s_copy);
}